

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O1

void printbitfield(rnnbitfield *bf,int shift)

{
  uint64_t val;
  char *suf;
  char *name;
  char *file;
  bool bVar1;
  
  if ((bf->varinfo).dead != 0) {
    return;
  }
  val = bf->mask << ((byte)shift & 0x3f);
  bVar1 = (bf->typeinfo).type != RNN_TTYPE_BOOLEAN;
  name = bf->fullname;
  file = bf->file;
  if (bVar1) {
    printdef(name,"MASK",0,val,file);
    val = (long)shift + (long)bf->low;
    name = bf->fullname;
    file = bf->file;
    suf = "SHIFT";
  }
  else {
    suf = (char *)0x0;
  }
  printdef(name,suf,(uint)bVar1,val,file);
  printtypeinfo(&bf->typeinfo,bf->fullname,shift + bf->low,bf->file);
  return;
}

Assistant:

void printbitfield (struct rnnbitfield *bf, int shift) {
	if (bf->varinfo.dead)
		return;
	if (bf->typeinfo.type == RNN_TTYPE_BOOLEAN) {
		printdef (bf->fullname, 0, 0, bf->mask << shift, bf->file);
	} else {
		printdef (bf->fullname, "MASK", 0, bf->mask << shift, bf->file);
		printdef (bf->fullname, "SHIFT", 1, bf->low + shift, bf->file);
	}
	printtypeinfo (&bf->typeinfo, bf->fullname, bf->low + shift, bf->file);
}